

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O1

DetectorResult *
ZXing::QRCode::SampleMQR
          (DetectorResult *__return_storage_ptr__,BitMatrix *image,ConcentricPattern *fp)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  Value VVar4;
  uint uVar5;
  uint32_t formatInfoBits;
  int iVar6;
  int width;
  uint uVar7;
  PerspectiveTransform *pPVar8;
  PerspectiveTransform *pPVar9;
  int i;
  long lVar10;
  int i_1;
  long lVar11;
  byte bVar12;
  PointF PVar14;
  PointF p;
  PointF p_00;
  PointF p_01;
  PointF PVar15;
  FormatInformation FVar16;
  Quadrilateral<ZXing::PointT<double>_> res;
  PerspectiveTransform bestPT;
  optional<ZXing::Quadrilateral<ZXing::PointT<double>_>_> fpQuad;
  PerspectiveTransform mod2Pix;
  undefined1 local_1f0 [56];
  QuadrilateralF local_1b8;
  undefined1 auStack_178 [8];
  BitMatrixCursor<ZXing::PointT<double>_> local_170;
  PerspectiveTransform local_148;
  optional<ZXing::Quadrilateral<ZXing::PointT<double>_>_> local_100;
  QuadrilateralF local_b8;
  PerspectiveTransform local_78;
  PointF p_02;
  double dVar13;
  
  bVar12 = 0;
  FindConcentricPatternCorners(&local_100,image,fp->super_PointF,fp->size,2);
  if (local_100.super__Optional_base<ZXing::Quadrilateral<ZXing::PointT<double>_>,_true,_true>.
      _M_payload.super__Optional_payload_base<ZXing::Quadrilateral<ZXing::PointT<double>_>_>.
      _M_engaged != false) {
    local_b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x = 0.5;
    local_b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y = 0.5;
    local_b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x = 6.5;
    local_b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y = 0.5;
    local_b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x = 6.5;
    local_b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y = 6.5;
    local_b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x = 0.5;
    local_b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y = 6.5;
    local_148.a33 = NAN;
    local_170.p.x = 0.0;
    local_170.p.y = 0.0;
    local_170.d.x = NAN;
    local_170.d.y = NAN;
    local_1f0._8_8_ = 0x400000000;
    local_1f0._0_8_ = 0xffffff00000000;
    lVar10 = 0;
    local_170.img = image;
    do {
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x = 0.0;
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y = 0.0;
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x = 0.0;
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y = 0.0;
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x = 0.0;
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y = 0.0;
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x = 0.0;
      local_1b8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y = 0.0;
      memcpy(&local_1b8,
             (void *)((long)&local_100.
                             super__Optional_base<ZXing::Quadrilateral<ZXing::PointT<double>_>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<ZXing::Quadrilateral<ZXing::PointT<double>_>_>
                             ._M_payload + lVar10 * 0x10),lVar10 * -0x10 + 0x40);
      if (lVar10 != 0) {
        memcpy(auStack_178 + lVar10 * -0x10,&local_100,lVar10 * 0x10);
      }
      PerspectiveTransform::PerspectiveTransform(&local_78,&local_b8,&local_1b8);
      PVar14.y = 8.5;
      PVar14.x = 0.5;
      PVar14 = PerspectiveTransform::operator()(&local_78,PVar14);
      dVar13 = PVar14.y;
      bVar2 = true;
      dVar1 = PVar14.x;
      if (((0.0 <= dVar1) && (dVar1 < (double)image->_width)) && (0.0 <= dVar13)) {
        bVar2 = (double)image->_height <= dVar13;
      }
      if (bVar2 == false) {
        bVar2 = BitMatrix::get(image,(int)dVar1,(int)dVar13);
      }
      else {
        bVar2 = (bool)(bVar2 ^ 1);
      }
      if (bVar2 != false) {
        PVar15.y = 8.5;
        PVar15.x = 8.5;
        PVar14 = PerspectiveTransform::operator()(&local_78,PVar15);
        if (((0.0 <= PVar14.x) && (PVar14.x < (double)image->_width)) &&
           ((0.0 <= PVar14.y && (PVar14.y < (double)image->_height)))) {
          p.y = 0.5;
          p.x = 8.5;
          PVar14 = PerspectiveTransform::operator()(&local_78,p);
          dVar13 = PVar14.y;
          bVar2 = true;
          dVar1 = PVar14.x;
          if (((0.0 <= dVar1) && (dVar1 < (double)image->_width)) && (0.0 <= dVar13)) {
            bVar2 = (double)image->_height <= dVar13;
          }
          if (bVar2 == false) {
            bVar2 = BitMatrix::get(image,(int)dVar1,(int)dVar13);
          }
          else {
            bVar2 = (bool)(bVar2 ^ 1);
          }
          if (bVar2 != false) {
            formatInfoBits = 0;
            lVar11 = 1;
            do {
              p_00.y = (double)(int)((ulong)*(undefined8 *)(&DAT_001a25e0 + lVar11 * 8) >> 0x20) +
                       0.5;
              p_00.x = (double)(int)*(undefined8 *)(&DAT_001a25e0 + lVar11 * 8) + 0.5;
              PVar14 = PerspectiveTransform::operator()(&local_78,p_00);
              VVar4 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>(&local_170,PVar14);
              formatInfoBits = (uint)(VVar4.v == 1) + formatInfoBits * 2;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0x10);
            FVar16 = FormatInformation::DecodeMQR(formatInfoBits);
            if ((FVar16._4_4_ >> 8 & 0xff) < (local_1f0._4_4_ >> 8 & 0xff)) {
              pPVar8 = &local_78;
              pPVar9 = &local_148;
              for (lVar11 = 9; local_1f0._0_16_ = (undefined1  [16])FVar16, lVar11 != 0;
                  lVar11 = lVar11 + -1) {
                pPVar9->a11 = pPVar8->a11;
                pPVar8 = (PerspectiveTransform *)((long)pPVar8 + (ulong)bVar12 * -0x10 + 8);
                pPVar9 = (PerspectiveTransform *)((long)pPVar9 + ((ulong)bVar12 * -2 + 1) * 8);
              }
            }
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    if ((local_1f0._0_16_ & (undefined1  [16])0xfc0000000000) == (undefined1  [16])0x0) {
      width = 0;
      iVar3 = (uint)local_1f0[9] * 2 + 9;
      uVar7 = 0;
      if (local_1f0[9] - 1 < 4) {
        local_1f0._0_8_ = (double)iVar3 + 0.5;
        uVar7 = 0;
        iVar6 = 0;
        do {
          p_01.y = (double)local_1f0._0_8_;
          p_01.x = (double)iVar6 + 0.5;
          PVar14 = PerspectiveTransform::operator()(&local_148,p_01);
          local_1f0._8_8_ = PVar14.x;
          p_02.y = (double)iVar6 + 0.5;
          p_02.x = (double)local_1f0._0_8_;
          PVar15 = PerspectiveTransform::operator()(&local_148,p_02);
          VVar4 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>(&local_170,PVar14);
          uVar5 = 0;
          if (VVar4.v == 1) {
            VVar4 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>(&local_170,PVar15);
            uVar5 = (uint)(VVar4.v == 1);
          }
          uVar7 = uVar7 + uVar5;
          iVar6 = iVar6 + 1;
          width = iVar3;
        } while (iVar3 + (uint)(iVar3 == 0) != iVar6);
      }
      if (uVar7 <= (uint)(width * 2) / 3) {
        SampleGrid(__return_storage_ptr__,image,width,width,&local_148);
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
  (__return_storage_ptr__->_bits)._bits.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->_bits)._bits.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_bits)._width = 0;
  (__return_storage_ptr__->_bits)._height = 0;
  (__return_storage_ptr__->_bits)._bits.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

DetectorResult SampleMQR(const BitMatrix& image, const ConcentricPattern& fp)
{
	auto fpQuad = FindConcentricPatternCorners(image, fp, fp.size, 2);
	if (!fpQuad)
		return {};

	auto srcQuad = Rectangle(7, 7, 0.5);

#if defined(_MSVC_LANG) // TODO: see MSVC issue https://developercommunity.visualstudio.com/t/constexpr-object-is-unable-to-be-used-as/10035065
	static
#else
	constexpr
#endif
		const PointI FORMAT_INFO_COORDS[] = {{0, 8}, {1, 8}, {2, 8}, {3, 8}, {4, 8}, {5, 8}, {6, 8}, {7, 8}, {8, 8},
											 {8, 7}, {8, 6}, {8, 5}, {8, 4}, {8, 3}, {8, 2}, {8, 1}, {8, 0}};

	FormatInformation bestFI;
	PerspectiveTransform bestPT;
	BitMatrixCursorF cur(image, {}, {});

	for (int i = 0; i < 4; ++i) {
		auto mod2Pix = PerspectiveTransform(srcQuad, RotatedCorners(*fpQuad, i));

		auto check = [&](int i, bool checkOne) {
			auto p = mod2Pix(centered(FORMAT_INFO_COORDS[i]));
			return image.isIn(p) && (!checkOne || image.get(p));
		};

		// check that we see both innermost timing pattern modules
		if (!check(0, true) || !check(8, false) || !check(16, true))
			continue;

		int formatInfoBits = 0;
		for (int i = 1; i <= 15; ++i)
			AppendBit(formatInfoBits, cur.blackAt(mod2Pix(centered(FORMAT_INFO_COORDS[i]))));

		auto fi = FormatInformation::DecodeMQR(formatInfoBits);
		if (fi.hammingDistance < bestFI.hammingDistance) {
			bestFI = fi;
			bestPT = mod2Pix;
		}
	}

	if (!bestFI.isValid())
		return {};

	const int dim = Version::SymbolSize(bestFI.microVersion, Type::Micro).x;

	// check that we are in fact not looking at a corner of a non-micro QRCode symbol
	// we accept at most 1/3rd black pixels in the quite zone (in a QRCode symbol we expect about 1/2).
	int blackPixels = 0;
	for (int i = 0; i < dim; ++i) {
		auto px = bestPT(centered(PointI{i, dim}));
		auto py = bestPT(centered(PointI{dim, i}));
		blackPixels += cur.blackAt(px) && cur.blackAt(py);
	}
	if (blackPixels > 2 * dim / 3)
		return {};

	return SampleGrid(image, dim, dim, bestPT);
}

DetectorResult SampleRMQR(const BitMatrix& image, const ConcentricPattern& fp)
{
	auto fpQuad = FindConcentricPatternCorners(image, fp, fp.size, 2);
	if (!fpQuad)
		return {};

	auto srcQuad = Rectangle(7, 7, 0.5);

	static const PointI FORMAT_INFO_EDGE_COORDS[] = {{8, 0}, {9, 0}, {10, 0}, {11, 0}};
	static const PointI FORMAT_INFO_COORDS[] = {
		{11, 3}, {11, 2}, {11, 1},
		{10, 5}, {10, 4}, {10, 3}, {10, 2}, {10, 1},
		{ 9, 5}, { 9, 4}, { 9, 3}, { 9, 2}, { 9, 1},
		{ 8, 5}, { 8, 4}, { 8, 3}, { 8, 2}, { 8, 1},
	};

	FormatInformation bestFI;
	PerspectiveTransform bestPT;
	BitMatrixCursorF cur(image, {}, {});

	for (int i = 0; i < 4; ++i) {
		auto mod2Pix = PerspectiveTransform(srcQuad, RotatedCorners(*fpQuad, i));

		auto check = [&](int i, bool on) {
			return cur.testAt(mod2Pix(centered(FORMAT_INFO_EDGE_COORDS[i]))) == BitMatrixCursorF::Value(on);
		};

		// check that we see top edge timing pattern modules
		if (!check(0, true) || !check(1, false) || !check(2, true) || !check(3, false))
			continue;

		uint32_t formatInfoBits = 0;
		for (int i = 0; i < Size(FORMAT_INFO_COORDS); ++i)
			AppendBit(formatInfoBits, cur.blackAt(mod2Pix(centered(FORMAT_INFO_COORDS[i]))));

		auto fi = FormatInformation::DecodeRMQR(formatInfoBits, 0 /*formatInfoBits2*/);
		if (fi.hammingDistance < bestFI.hammingDistance) {
			bestFI = fi;
			bestPT = mod2Pix;
		}
	}

	if (!bestFI.isValid())
		return {};

	const PointI dim = Version::SymbolSize(bestFI.microVersion, Type::rMQR);

	// TODO: this is a WIP
	auto intersectQuads = [](QuadrilateralF& a, QuadrilateralF& b) {
		auto tl = Center(a);
		auto br = Center(b);
		// rotate points such that topLeft of a is furthest away from b and topLeft of b is closest to a
		auto dist2B = [c = br](auto a, auto b) { return distance(a, c) < distance(b, c); };
		auto offsetA = narrow_cast<int>(std::max_element(a.begin(), a.end(), dist2B) - a.begin());
		auto dist2A = [c = tl](auto a, auto b) { return distance(a, c) < distance(b, c); };
		auto offsetB = narrow_cast<int>(std::min_element(b.begin(), b.end(), dist2A) - b.begin());

		a = RotatedCorners(a, offsetA);
		b = RotatedCorners(b, offsetB);

		auto tr = (intersect(RegressionLine(a[0], a[1]), RegressionLine(b[1], b[2]))
				   + intersect(RegressionLine(a[3], a[2]), RegressionLine(b[0], b[3])))
				  / 2;
		auto bl = (intersect(RegressionLine(a[0], a[3]), RegressionLine(b[2], b[3]))
				   + intersect(RegressionLine(a[1], a[2]), RegressionLine(b[0], b[1])))
				  / 2;

		log(tr, 2);
		log(bl, 2);

		return QuadrilateralF{tl, tr, br, bl};
	};

	if (auto found = LocateAlignmentPattern(image, fp.size / 7, bestPT(dim - PointF(3, 3)))) {
		log(*found, 2);
		if (auto spQuad = FindConcentricPatternCorners(image, *found, fp.size / 2, 1)) {
			auto dest = intersectQuads(*fpQuad, *spQuad);
			if (dim.y <= 9) {
				bestPT = PerspectiveTransform({{6.5, 0.5}, {dim.x - 1.5, dim.y - 3.5}, {dim.x - 1.5, dim.y - 1.5}, {6.5, 6.5}},
											  {fpQuad->topRight(), spQuad->topRight(), spQuad->bottomRight(), fpQuad->bottomRight()});
			} else {
				dest[0] = fp;
				dest[2] = *found;
				bestPT = PerspectiveTransform({{3.5, 3.5}, {dim.x - 2.5, 3.5}, {dim.x - 2.5, dim.y - 2.5}, {3.5, dim.y - 2.5}}, dest);
			}
		}
	}

	return SampleGrid(image, dim.x, dim.y, bestPT);
}

}